

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O3

void __thiscall
S2VertexIdLaxLoopShape::Init
          (S2VertexIdLaxLoopShape *this,vector<int,_std::allocator<int>_> *vertex_ids,
          S2Point *vertex_array)

{
  int *piVar1;
  pointer __src;
  ulong uVar2;
  long lVar3;
  int *piVar4;
  size_t __n;
  
  uVar2 = (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  *(int *)&(this->super_S2Shape).field_0xc = (int)(uVar2 >> 2);
  lVar3 = uVar2 * 0x40000000;
  uVar2 = 0xffffffffffffffff;
  if (-1 < lVar3) {
    uVar2 = lVar3 >> 0x1e;
  }
  piVar4 = (int *)operator_new__(uVar2);
  piVar1 = (this->vertex_ids_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  (this->vertex_ids_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = piVar4;
  if (piVar1 != (int *)0x0) {
    operator_delete__(piVar1);
  }
  __src = (vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start;
  __n = (long)(vertex_ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((this->vertex_ids_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl,__src,__n);
  }
  this->vertex_array_ = vertex_array;
  return;
}

Assistant:

void S2VertexIdLaxLoopShape::Init(const std::vector<int32>& vertex_ids,
                           const S2Point* vertex_array) {
  num_vertices_ = vertex_ids.size();
  vertex_ids_.reset(new int32[num_vertices_]);
  std::copy(vertex_ids.begin(), vertex_ids.end(), vertex_ids_.get());
  vertex_array_ = vertex_array;
}